

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1373::run(TestCase1373 *this)

{
  SegmentReader *pSVar1;
  undefined1 auVar2 [8];
  Orphan<capnp::Text> *pOVar3;
  Orphan<capnp::Text> *pOVar4;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  SegmentBuilder *pSVar13;
  SegmentBuilder *pSVar14;
  char *pcVar15;
  uint *puVar16;
  uint *params_1;
  uint *puVar17;
  uint i_1;
  size_t sVar18;
  long lVar19;
  uint i;
  long lVar20;
  bool bVar21;
  Orphanage OVar22;
  Builder BVar23;
  Reader RVar24;
  Reader RVar25;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> reader;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> builder;
  Vector<capnp::Orphan<capnp::Text>_> pointers;
  Orphan<capnp::List<capnp::Text,_(capnp::Kind)1>_> orphan;
  Orphan<capnp::Data> orphan2;
  MallocMessageBuilder message;
  char local_22c [4];
  PointerReader local_228;
  ArrayPtr<const_char> local_208;
  undefined8 *local_1f8;
  ListReader local_1f0;
  undefined1 local_1c0 [24];
  ulong uStack_1a8;
  undefined1 local_198 [8];
  Orphan<capnp::Text> *pOStack_190;
  Orphan<capnp::Text> *local_188;
  ArrayDisposer *local_180;
  OrphanBuilder local_170;
  OrphanBuilder local_150;
  ArrayPtr<const_char> local_130;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  local_198 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x20,0,7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar13 = (SegmentBuilder *)local_198;
  local_188 = (Orphan<capnp::Text> *)((long)local_198 + 0xe0);
  local_180 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_170.tag.content = (ulong)local_170.tag.content._4_4_ << 0x20;
  pOStack_190 = (Orphan<capnp::Text> *)local_198;
  do {
    OVar22 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&local_228,(kj *)"foo",(char (*) [4])&local_170,(uint *)pSVar13);
    OrphanBuilder::copy((EVP_PKEY_CTX *)&local_1f0,(EVP_PKEY_CTX *)OVar22.arena);
    uStack_1a8 = CONCAT44(local_1f0.step,local_1f0.elementCount);
    local_1c0._16_8_ = local_1f0.ptr;
    local_1c0._0_8_ = local_1f0.segment;
    local_1c0._8_8_ = local_1f0.capTable;
    if (pOStack_190 == local_188) {
      sVar18 = (long)local_188 - (long)local_198 >> 4;
      if ((undefined1  [8])local_188 == local_198) {
        sVar18 = 4;
      }
      kj::Vector<capnp::Orphan<capnp::Text>_>::setCapacity
                ((Vector<capnp::Orphan<capnp::Text>_> *)local_198,sVar18);
    }
    pSVar14 = (SegmentBuilder *)local_228.capTable;
    pSVar1 = local_228.segment;
    (pOStack_190->builder).segment = (SegmentBuilder *)local_1c0._8_8_;
    (pOStack_190->builder).capTable = (CapTableBuilder *)local_1c0._16_8_;
    (pOStack_190->builder).location = (word *)uStack_1a8;
    (pOStack_190->builder).tag.content = local_1c0._0_8_;
    pOStack_190 = pOStack_190 + 1;
    local_1c0._8_8_ = (SegmentBuilder *)0x0;
    uStack_1a8 = 0;
    pSVar13 = (SegmentBuilder *)local_1c0._0_8_;
    if ((SegmentBuilder *)local_228.segment != (SegmentBuilder *)0x0) {
      local_228.segment = (SegmentReader *)0x0;
      local_228.capTable = (CapTableReader *)0x0;
      (**(code **)*local_228.pointer)(local_228.pointer,pSVar1,1,pSVar14,pSVar14,0);
      pSVar13 = pSVar14;
    }
    uVar10 = (uint)local_170.tag.content + 1;
    local_170.tag.content._0_4_ = uVar10;
  } while (uVar10 < 7);
  OVar22 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_1f0,OVar22.arena,OVar22.capTable,7,POINTER);
  local_170.capTable = (CapTableBuilder *)local_1f0.ptr;
  local_170.tag.content = (uint64_t)local_1f0.segment;
  local_170.segment = (SegmentBuilder *)local_1f0.capTable;
  OrphanBuilder::asList((ListBuilder *)local_1c0,&local_170,POINTER);
  lVar19 = 0;
  lVar20 = 0;
  do {
    local_1f0.ptr =
         (byte *)((long)&((CapTableReader *)local_1c0._16_8_)->_vptr_CapTableReader +
                 ((uStack_1a8 >> 0x20) * lVar20 >> 3));
    local_1f0.segment = (SegmentReader *)local_1c0._0_8_;
    local_1f0.capTable = (CapTableReader *)local_1c0._8_8_;
    PointerBuilder::adopt
              ((PointerBuilder *)&local_1f0,
               (OrphanBuilder *)((long)&(((OrphanBuilder *)local_198)->tag).content + lVar19));
    lVar20 = lVar20 + 1;
    lVar19 = lVar19 + 0x20;
  } while (lVar20 != 7);
  OVar22 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  pcVar15 = (char *)0x1;
  OrphanBuilder::initData((OrphanBuilder *)&local_1f0,OVar22.arena,OVar22.capTable,1);
  local_150.capTable = (CapTableBuilder *)local_1f0.ptr;
  local_150.tag.content = (uint64_t)local_1f0.segment;
  local_150.segment = (SegmentBuilder *)local_1f0.capTable;
  BVar23 = OrphanBuilder::asData(&local_150);
  *BVar23.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanBuilder::truncate(&local_170,(char *)0xb,6);
  OrphanBuilder::asListReader(&local_1f0,&local_170,POINTER);
  if ((local_1f0.elementCount != 0xb) &&
     (pcVar15 = (char *)&kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
    local_228.segment = (SegmentReader *)CONCAT44(local_228.segment._4_4_,0xb);
    local_208.ptr._0_4_ = local_1f0.elementCount;
    pcVar15 = "\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()";
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x572,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_228,
               (uint *)&local_208);
  }
  local_22c[0] = '\0';
  local_22c[1] = '\0';
  local_22c[2] = '\0';
  local_22c[3] = '\0';
  do {
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&local_208,(kj *)"foo",&local_22c,(uint *)pcVar15);
    local_228.pointer =
         (WirePointer *)
         ((long)&((WireValue<uint32_t> *)local_1f0.ptr)->value +
         ((ulong)local_1f0.step * (ulong)(uint)local_22c >> 3));
    local_228.segment = local_1f0.segment;
    local_228.capTable = local_1f0.capTable;
    local_228.nestingLimit = local_1f0.nestingLimit;
    RVar24 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    params_1 = RVar24.super_StringPtr.content.size_;
    puVar16 = (uint *)local_208.size_;
    puVar17 = (uint *)(local_208.size_ + ((uint *)local_208.size_ == (uint *)0x0));
    bVar21 = true;
    if (puVar17 == params_1) {
      pcVar15 = "";
      if ((uint *)local_208.size_ != (uint *)0x0) {
        pcVar15 = local_208.ptr;
      }
      iVar11 = bcmp(pcVar15,RVar24.super_StringPtr.content.ptr,(long)puVar17 - 1);
      bVar21 = iVar11 != 0;
    }
    pcVar15 = local_208.ptr;
    if (local_208.ptr != (char *)0x0) {
      local_208 = (ArrayPtr<const_char>)ZEXT816(0);
      (**(code **)*local_1f8)(local_1f8,pcVar15,1,puVar16,puVar16,0);
      params_1 = puVar16;
    }
    if ((bool)(bVar21 & kj::_::Debug::minSeverity < 3)) {
      kj::str<char_const(&)[4],unsigned_int&>((String *)&local_208,(kj *)"foo",&local_22c,params_1);
      local_228.pointer =
           (WirePointer *)
           ((long)&((WireValue<uint32_t> *)local_1f0.ptr)->value +
           ((ulong)local_1f0.step * (ulong)(uint)local_22c >> 3));
      local_228.segment = local_1f0.segment;
      local_228.capTable = local_1f0.capTable;
      local_228.nestingLimit = local_1f0.nestingLimit;
      local_130 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[52],kj::String,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x575,ERROR,
                 "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
                 ,(char (*) [52])"failed: expected (kj::str(\"foo\", i)) == (reader[i])",
                 (String *)&local_208,(Reader *)&local_130);
      pcVar15 = local_208.ptr;
      if (local_208.ptr != (char *)0x0) {
        sVar18 = local_208.size_;
        local_208 = (ArrayPtr<const_char>)ZEXT816(0);
        (**(code **)*local_1f8)(local_1f8,pcVar15,1,sVar18,sVar18);
      }
    }
    local_228.pointer =
         (WirePointer *)
         ((long)&((CapTableReader *)local_1c0._16_8_)->_vptr_CapTableReader +
         ((uStack_1a8 >> 0x20) * (ulong)(uint)local_22c >> 3));
    local_228.segment = (SegmentReader *)local_1c0._0_8_;
    local_228.capTable = (CapTableReader *)local_1c0._8_8_;
    pcVar15 = (char *)0x0;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_208,(PointerBuilder *)&local_228,(void *)0x0,0);
    if (((undefined8 *)0x1 < local_1f8) && (kj::_::Debug::minSeverity < 3)) {
      pcVar15 = "\"failed: expected \" \"builder[i] == nullptr\"";
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x576,ERROR,"\"failed: expected \" \"builder[i] == nullptr\"",
                 (char (*) [39])"failed: expected builder[i] == nullptr");
    }
    local_22c = (char  [4])((int)local_22c + 1);
  } while ((uint)local_22c < 7);
  lVar19 = 7;
  do {
    local_228.pointer =
         (WirePointer *)
         ((long)&((WireValue<uint32_t> *)local_1f0.ptr)->value +
         ((ulong)local_1f0.step * lVar19 >> 3));
    local_228.segment = local_1f0.segment;
    local_228.capTable = local_1f0.capTable;
    local_228.nestingLimit = local_1f0.nestingLimit;
    RVar24 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    if ((1 < RVar24.super_StringPtr.content.size_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x579,ERROR,"\"failed: expected \" \"reader[i] == nullptr\"",
                 (char (*) [38])"failed: expected reader[i] == nullptr");
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xb);
  local_228.segment = (SegmentReader *)local_1c0._0_8_;
  local_228.capTable = (CapTableReader *)local_1c0._8_8_;
  local_228.pointer = (WirePointer *)local_1c0._16_8_;
  RVar24.super_StringPtr.content.size_ = 4;
  RVar24.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_228,RVar24);
  local_228.segment = local_1f0.segment;
  local_228.capTable = local_1f0.capTable;
  local_228.pointer = (WirePointer *)local_1f0.ptr;
  local_228.nestingLimit = local_1f0.nestingLimit;
  RVar24 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
  pSVar13 = (SegmentBuilder *)local_228.segment;
  pSVar14 = (SegmentBuilder *)local_228.capTable;
  pWVar5 = local_228.pointer;
  iVar11 = local_228.nestingLimit;
  pSVar6 = (SegmentBuilder *)local_1f0.segment;
  pSVar7 = (SegmentBuilder *)local_1f0.capTable;
  pWVar8 = (WirePointer *)local_1f0.ptr;
  iVar9 = local_1f0.nestingLimit;
  if (((RVar24.super_StringPtr.content.size_ != 5) ||
      (iVar12 = bcmp(RVar24.super_StringPtr.content.ptr,"foo0",4),
      pSVar13 = (SegmentBuilder *)local_228.segment, pSVar14 = (SegmentBuilder *)local_228.capTable,
      pWVar5 = local_228.pointer, iVar11 = local_228.nestingLimit,
      pSVar6 = (SegmentBuilder *)local_1f0.segment, pSVar7 = (SegmentBuilder *)local_1f0.capTable,
      pWVar8 = (WirePointer *)local_1f0.ptr, iVar9 = local_1f0.nestingLimit, iVar12 != 0)) &&
     (local_228.nestingLimit = iVar9, local_228.pointer = pWVar8,
     local_228.capTable = (CapTableReader *)pSVar7, local_228.segment = &pSVar6->super_SegmentReader
     , local_1f0.segment = local_228.segment, local_1f0.capTable = local_228.capTable,
     local_1f0.ptr = (byte *)local_228.pointer, kj::_::Debug::minSeverity < 3)) {
    local_208 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[41],char_const(&)[5],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x57f,ERROR,
               "\"failed: expected \" \"(\\\"foo0\\\") == (reader[0])\", \"foo0\", reader[0]",
               (char (*) [41])"failed: expected (\"foo0\") == (reader[0])",(char (*) [5])"foo0",
               (Reader *)&local_208);
    pSVar13 = (SegmentBuilder *)local_228.segment;
    pSVar14 = (SegmentBuilder *)local_228.capTable;
    pWVar5 = local_228.pointer;
    iVar11 = local_228.nestingLimit;
  }
  local_228.nestingLimit = iVar11;
  local_228.pointer = pWVar5;
  local_228.capTable = (CapTableReader *)pSVar14;
  local_228.segment = &pSVar13->super_SegmentReader;
  RVar25 = OrphanBuilder::asDataReader(&local_150);
  if ((*RVar25.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_228.segment = (SegmentReader *)CONCAT44(local_228.segment._4_4_,0x20);
    RVar25 = OrphanBuilder::asDataReader(&local_150);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x581,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_228
               ,RVar25.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  if (local_150.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_150);
  }
  if (local_170.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_170);
  }
  pOVar4 = local_188;
  pOVar3 = pOStack_190;
  auVar2 = local_198;
  if (local_198 != (undefined1  [8])0x0) {
    local_198 = (undefined1  [8])0x0;
    pOStack_190 = (Orphan<capnp::Text> *)0x0;
    local_188 = (Orphan<capnp::Text> *)0x0;
    (*(code *)**(undefined8 **)local_180)
              (local_180,auVar2,0x20,(long)pOVar3 - (long)auVar2 >> 5,
               (long)pOVar4 - (long)auVar2 >> 5,
               kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::Text>,_false>::destruct);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListCopy) {
  MallocMessageBuilder message;

  // Allocate data in advance so that the list itself is at the end of the segment.
  kj::Vector<Orphan<Text>> pointers(7);
  for (uint i = 0; i < 7; i++) {
    pointers.add(message.getOrphanage().newOrphanCopy(Text::Reader(kj::str("foo", i))));
  }

  auto orphan = message.getOrphanage().newOrphan<List<Text>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.adopt(i, kj::mv(pointers[i]));
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(kj::str("foo", i), reader[i]);
    EXPECT_TRUE(builder[i] == nullptr);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_TRUE(reader[i] == nullptr);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, "bar");
  EXPECT_EQ("foo0", reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}